

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_file_get_external_attributes.c
# Opt level: O2

int zip_file_get_external_attributes
              (zip_t *za,zip_uint64_t idx,zip_flags_t flags,zip_uint8_t *opsys,
              zip_uint32_t *attributes)

{
  zip_dirent_t *pzVar1;
  int iVar2;
  
  pzVar1 = _zip_get_dirent(za,idx,flags,(zip_error_t *)0x0);
  if (pzVar1 == (zip_dirent_t *)0x0) {
    iVar2 = -1;
  }
  else {
    if (opsys != (zip_uint8_t *)0x0) {
      *opsys = *(zip_uint8_t *)((long)&pzVar1->version_madeby + 1);
    }
    iVar2 = 0;
    if (attributes != (zip_uint32_t *)0x0) {
      *attributes = pzVar1->ext_attrib;
    }
  }
  return iVar2;
}

Assistant:

int
zip_file_get_external_attributes(zip_t *za, zip_uint64_t idx, zip_flags_t flags, zip_uint8_t *opsys, zip_uint32_t *attributes) {
    zip_dirent_t *de;

    if ((de = _zip_get_dirent(za, idx, flags, NULL)) == NULL)
        return -1;

    if (opsys)
        *opsys = (zip_uint8_t)((de->version_madeby >> 8) & 0xff);

    if (attributes)
        *attributes = de->ext_attrib;

    return 0;
}